

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O1

bool FactoredDecPOMDPDiscrete::ConsistentVectorsOnSpecifiedScopes
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *v1,Scope *scope1,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *v2,Scope *scope2)

{
  pointer puVar1;
  Index *pIVar2;
  Index *pIVar3;
  Index IVar4;
  Index *pIVar5;
  ulong uVar6;
  
  pIVar2 = (scope2->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pIVar3 = (scope2->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = 0;
  do {
    pIVar5 = pIVar3;
    if (pIVar5 == pIVar2) break;
    IVar4 = Scope::GetPositionForIndex(scope1,*pIVar5);
    puVar1 = (v2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start + uVar6;
    pIVar3 = pIVar5 + 1;
    uVar6 = (ulong)((int)uVar6 + 1);
  } while ((v1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start[IVar4] == *puVar1);
  return pIVar5 == pIVar2;
}

Assistant:

bool FactoredDecPOMDPDiscrete::
ConsistentVectorsOnSpecifiedScopes( 
                                        const std::vector<Index>& v1, 
                                        const Scope& scope1,
                                        const std::vector<Index>& v2,
                                        const Scope& scope2)
{
    Scope::const_iterator s2_it = scope2.begin();
    Scope::const_iterator s2_last = scope2.end();
    Index v2_I = 0;
    while(s2_it != s2_last)
    {
        //check that v1 specifies the same value for variable *s2_it
        Index varI = *s2_it;
        Index pos_in_v1 = scope1.GetPositionForIndex(varI);
        if(v1[pos_in_v1] != v2[v2_I] )
            return false;

        s2_it++;
        v2_I++;
    }
    return true;

}